

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_f34fd4::SegmentTree::produceIntersections
          (SegmentTree *this,TreeNode *node,int segment,RectF *segmentBounds,RectF *nodeBounds,
          int axis)

{
  QDataBuffer<QIntersection> *this_00;
  QPointF *pQVar1;
  qreal qVar2;
  qreal qVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  QPointF *pQVar7;
  Segment *pSVar8;
  QPathSegments *pQVar9;
  Segment *pSVar10;
  QIntersection *pQVar11;
  Intersection *pIVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  qreal qVar18;
  QPointF QVar19;
  undefined1 auVar20 [16];
  QPointF QVar21;
  QPointF QVar22;
  Intersection *pIVar23;
  bool bVar24;
  int iVar25;
  uint uVar26;
  undefined7 uVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  long in_FS_OFFSET;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  double dVar57;
  double dVar58;
  double dVar59;
  qreal invDp;
  RectF local_78;
  undefined1 local_58 [16];
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (node->leaf == true) {
    iVar25 = (node->index).interval.first;
    lVar33 = (long)iVar25;
    if (iVar25 < (node->index).interval.last) {
      pQVar7 = (this->m_segments->m_points).buffer;
      pSVar8 = (this->m_segments->m_segments).buffer;
      pQVar1 = pQVar7 + pSVar8[segment].va;
      dVar4 = pQVar1->xp;
      dVar14 = pQVar1->yp;
      QVar21 = *pQVar1;
      pQVar7 = pQVar7 + pSVar8[segment].vb;
      dVar15 = pQVar7->xp;
      dVar16 = pQVar7->yp;
      QVar22 = *pQVar7;
      this_00 = &this->m_intersections;
      dVar39 = dVar4 - dVar15;
      dVar47 = dVar14 - dVar16;
      uVar36 = -(ulong)(dVar39 < -dVar39);
      uVar37 = -(ulong)(dVar47 < -dVar47);
      dVar53 = dVar15 - dVar4;
      dVar52 = dVar16 - dVar14;
      dVar40 = 1.0 / (dVar53 * dVar53 + dVar52 * dVar52);
      auVar44._8_8_ = -(ulong)(1e-12 < (double)(~uVar37 & (ulong)dVar47 | (ulong)-dVar47 & uVar37));
      auVar44._0_8_ = -(ulong)(1e-12 < (double)(~uVar36 & (ulong)dVar39 | (ulong)-dVar39 & uVar36));
      iVar25 = movmskpd((int)this_00,auVar44);
      do {
        iVar5 = (this->m_index).d.ptr[lVar33];
        if (iVar5 < segment) {
          pQVar9 = this->m_segments;
          pSVar10 = (pQVar9->m_segments).buffer;
          dVar39 = pSVar8[segment].bounds.xp;
          dVar47 = pSVar10[iVar5].bounds.xp;
          if ((dVar39 <= pSVar10[iVar5].bounds.w + dVar47) &&
             (dVar47 <= dVar39 + pSVar8[segment].bounds.w)) {
            dVar39 = pSVar8[segment].bounds.yp;
            dVar47 = pSVar10[iVar5].bounds.yp;
            if ((dVar39 <= pSVar10[iVar5].bounds.h + dVar47) &&
               (dVar47 <= dVar39 + pSVar8[segment].bounds.h)) {
              (this->m_intersections).siz = 0;
              if (iVar25 != 0) {
                pQVar7 = (pQVar9->m_points).buffer;
                pQVar1 = pQVar7 + pSVar10[iVar5].va;
                dVar39 = pQVar1->xp;
                dVar47 = pQVar1->yp;
                pQVar7 = pQVar7 + pSVar10[iVar5].vb;
                dVar57 = pQVar7->xp;
                dVar17 = pQVar7->yp;
                QVar19 = *pQVar7;
                dVar41 = dVar39 - dVar57;
                uVar36 = -(ulong)(dVar41 < -dVar41);
                if ((1e-12 < (double)(~uVar36 & (ulong)dVar41 | (ulong)-dVar41 & uVar36)) ||
                   (dVar41 = dVar47 - dVar17, uVar36 = -(ulong)(dVar41 < -dVar41),
                   1e-12 < (double)(~uVar36 & (ulong)dVar41 | (ulong)-dVar41 & uVar36))) {
                  dVar41 = dVar4 - dVar39;
                  uVar36 = -(ulong)(dVar41 < -dVar41);
                  if ((double)(~uVar36 & (ulong)dVar41 | (ulong)-dVar41 & uVar36) <= 1e-12) {
                    dVar42 = dVar14 - dVar47;
                    uVar36 = -(ulong)(dVar42 < -dVar42);
                    bVar24 = (double)(~uVar36 & (ulong)dVar42 | (ulong)-dVar42 & uVar36) <= 1e-12;
                    uVar27 = (undefined7)((ulong)((long)pSVar10[iVar5].vb * 0x10) >> 8);
                  }
                  else {
                    bVar24 = false;
                    uVar27 = 0;
                  }
                  dVar42 = dVar15 - dVar57;
                  uVar36 = -(ulong)(dVar42 < -dVar42);
                  if ((double)(~uVar36 & (ulong)dVar42 | (ulong)-dVar42 & uVar36) <= 1e-12) {
                    dVar42 = dVar16 - dVar17;
                    uVar36 = -(ulong)(dVar42 < -dVar42);
                    bVar28 = (double)(~uVar36 & (ulong)dVar42 | (ulong)-dVar42 & uVar36) <= 1e-12;
                  }
                  else {
                    bVar28 = false;
                  }
                  if ((bVar24 & bVar28) == 0) {
                    dVar42 = dVar4 - dVar57;
                    uVar36 = -(ulong)(dVar42 < -dVar42);
                    if ((double)(~uVar36 & (ulong)dVar42 | (ulong)-dVar42 & uVar36) <= 1e-12) {
                      dVar42 = dVar14 - dVar17;
                      uVar36 = -(ulong)(dVar42 < -dVar42);
                      bVar29 = (double)(~uVar36 & (ulong)dVar42 | (ulong)-dVar42 & uVar36) <= 1e-12;
                    }
                    else {
                      bVar29 = false;
                    }
                    dVar42 = dVar15 - dVar39;
                    uVar36 = -(ulong)(dVar42 < -dVar42);
                    if ((double)(~uVar36 & (ulong)dVar42 | (ulong)-dVar42 & uVar36) <= 1e-12) {
                      dVar58 = dVar16 - dVar47;
                      uVar36 = -(ulong)(dVar58 < -dVar58);
                      bVar30 = (double)(~uVar36 & (ulong)dVar58 | (ulong)-dVar58 & uVar36) <= 1e-12;
                    }
                    else {
                      bVar30 = false;
                    }
                    if ((bVar29 & bVar30) == 0) {
                      dVar58 = dVar57 - dVar39;
                      dVar59 = dVar17 - dVar47;
                      auVar49._0_8_ = dVar53 * dVar59 + dVar58 * -dVar52;
                      uVar36 = -(ulong)(auVar49._0_8_ < -auVar49._0_8_);
                      if ((double)(~uVar36 & (ulong)auVar49._0_8_ | (ulong)-auVar49._0_8_ & uVar36)
                          <= 1e-12) {
                        dVar48 = -dVar52 * (dVar39 - dVar4) + dVar53 * (dVar47 - dVar14);
                        uVar36 = -(ulong)(dVar48 < -dVar48);
                        if ((double)(~uVar36 & (ulong)dVar48 | (ulong)-dVar48 & uVar36) <= 1e-12) {
                          dVar39 = ((dVar39 - dVar4) * dVar53 + (dVar47 - dVar14) * dVar52) * dVar40
                          ;
                          if ((0.0 < dVar39) && (dVar39 < 1.0)) {
                            local_58._8_8_ = 0;
                            local_58._0_8_ = dVar39;
                            local_48 = *pQVar1;
                            QDataBuffer<QIntersection>::add(this_00,(QIntersection *)local_58);
                          }
                          dVar39 = ((dVar17 - dVar14) * dVar52 + dVar53 * (dVar57 - dVar4)) * dVar40
                          ;
                          if ((0.0 < dVar39) && (dVar39 < 1.0)) {
                            local_58._8_8_ = 0x3ff0000000000000;
                            local_58._0_8_ = dVar39;
                            local_48 = QVar19;
                            QDataBuffer<QIntersection>::add(this_00,(QIntersection *)local_58);
                          }
                          dVar39 = 1.0 / (dVar58 * dVar58 + dVar59 * dVar59);
                          dVar57 = (dVar41 * dVar58 + (dVar14 - dVar47) * dVar59) * dVar39;
                          if ((0.0 < dVar57) && (dVar57 < 1.0)) {
                            auVar20._8_8_ = 0;
                            auVar20._0_8_ = dVar57;
                            local_58 = auVar20 << 0x40;
                            local_48 = QVar21;
                            QDataBuffer<QIntersection>::add(this_00,(QIntersection *)local_58);
                          }
                          dVar39 = (dVar58 * dVar42 + (dVar16 - dVar47) * dVar59) * dVar39;
                          if ((0.0 < dVar39) && (dVar39 < 1.0)) {
                            local_58._8_8_ = dVar39;
                            local_58._0_8_ = 0x3ff0000000000000;
                            local_48 = QVar22;
LAB_003f6cff:
                            QDataBuffer<QIntersection>::add(this_00,(QIntersection *)local_58);
                          }
                        }
                      }
                      else if ((bVar28 == false && bVar30 == false) && (bVar24 | bVar29) == 0) {
                        auVar43._0_8_ = (dVar39 - dVar4) * dVar59 + -dVar58 * (dVar47 - dVar14);
                        auVar43._8_8_ = (dVar39 - dVar4) * dVar52 + -dVar53 * (dVar47 - dVar14);
                        auVar49._8_8_ = auVar49._0_8_;
                        auVar44 = divpd(auVar43,auVar49);
                        dVar41 = auVar44._0_8_;
                        dVar42 = auVar44._8_8_;
                        if ((((dVar42 <= 1.0) && (0.0 <= dVar42)) && (0.0 <= dVar41)) &&
                           (dVar41 <= 1.0)) {
                          dVar48 = dVar41 + -1.0;
                          uVar36 = -(ulong)(dVar41 < -dVar41);
                          uVar37 = -(ulong)(dVar48 < -dVar48);
                          auVar56._0_8_ = (ulong)-dVar41 & uVar36;
                          auVar56._8_8_ = (ulong)-dVar48 & uVar37;
                          auVar50._0_8_ = ~uVar36 & (ulong)dVar41;
                          auVar50._8_8_ = ~uVar37 & (ulong)dVar48;
                          uVar36 = -(ulong)(dVar42 < -dVar42);
                          dVar54 = (double)(~uVar36 & (ulong)dVar42 | (ulong)-dVar42 & uVar36);
                          dVar41 = dVar42 + -1.0;
                          uVar36 = -(ulong)(dVar41 < -dVar41);
                          dVar55 = (double)(~uVar36 & (ulong)dVar41 | (ulong)-dVar41 & uVar36);
                          dVar41 = SUB168(auVar50 | auVar56,0);
                          dVar48 = SUB168(auVar50 | auVar56,8);
                          auVar13._8_8_ = -(ulong)(dVar48 <= 1e-12);
                          auVar13._0_8_ = -(ulong)(dVar41 <= 1e-12);
                          iVar34 = movmskpd((int)CONCAT71(uVar27,bVar24 | bVar29),auVar13);
                          if ((1e-12 < dVar54 && 1e-12 < dVar55) || (iVar34 == 0)) {
                            uVar36 = -(ulong)(dVar41 <= 1e-12);
                            uVar37 = -(ulong)(dVar48 <= 1e-12);
                            uVar26 = (uint)(dVar55 <= 1e-12);
                            auVar38._0_8_ =
                                 CONCAT44((int)(uVar26 << 0x1f) >> 0x1f,
                                          (int)(uVar26 << 0x1f) >> 0x1f);
                            auVar38._8_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                            auVar38._12_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                            uVar26 = (uint)(dVar54 <= 1e-12 || iVar34 != 0);
                            auVar45._0_8_ =
                                 CONCAT44((int)(uVar26 << 0x1f) >> 0x1f,
                                          (int)(uVar26 << 0x1f) >> 0x1f);
                            auVar45._8_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                            auVar45._12_4_ = (int)(uVar26 << 0x1f) >> 0x1f;
                            auVar51._0_8_ =
                                 (~uVar36 & (~uVar37 & (ulong)dVar39 | (ulong)dVar15 & uVar37) |
                                 (ulong)dVar4 & uVar36) & auVar45._0_8_;
                            auVar51._8_8_ =
                                 (~uVar36 & (~uVar37 & (ulong)dVar47 | (ulong)dVar16 & uVar37) |
                                 (ulong)dVar14 & uVar36) & auVar45._8_8_;
                            auVar46._0_8_ =
                                 ~auVar45._0_8_ &
                                 (~auVar38._0_8_ & (ulong)(dVar58 * dVar42 + dVar39) |
                                 (ulong)dVar57 & auVar38._0_8_);
                            auVar46._8_8_ =
                                 ~auVar45._8_8_ &
                                 (~auVar38._8_8_ & (ulong)(dVar59 * dVar42 + dVar47) |
                                 (ulong)dVar17 & auVar38._8_8_);
                            local_58 = auVar44;
                            local_48 = (QPointF)(auVar46 | auVar51);
                            goto LAB_003f6cff;
                          }
                        }
                      }
                    }
                  }
                }
              }
              if (0 < (this->m_intersections).siz) {
                lVar32 = 0;
                do {
                  pQVar9 = this->m_segments;
                  pQVar11 = (this->m_intersections).buffer;
                  qVar2 = pQVar11[lVar32].alphaA;
                  qVar3 = pQVar11[lVar32].alphaB;
                  QDataBuffer<QPointF>::reserve(&pQVar9->m_points,(pQVar9->m_points).siz + 1);
                  qVar18 = pQVar11[lVar32].pos.yp;
                  pQVar1 = (pQVar9->m_points).buffer + (pQVar9->m_points).siz;
                  pQVar1->xp = pQVar11[lVar32].pos.xp;
                  pQVar1->yp = qVar18;
                  lVar35 = (pQVar9->m_points).siz + 1;
                  (pQVar9->m_points).siz = lVar35;
                  iVar34 = (int)lVar35 + -1;
                  pQVar9 = this->m_segments;
                  QDataBuffer<QPathSegments::Intersection>::reserve
                            (&pQVar9->m_intersections,(pQVar9->m_intersections).siz + 1);
                  lVar35 = (pQVar9->m_intersections).siz;
                  pIVar12 = (pQVar9->m_intersections).buffer;
                  pIVar12[lVar35].t = qVar2;
                  pIVar12[lVar35].vertex = iVar34;
                  pIVar12[lVar35].next = 0;
                  (pQVar9->m_intersections).siz = lVar35 + 1;
                  pSVar10 = (pQVar9->m_segments).buffer;
                  lVar31 = (long)pSVar10[segment].intersection;
                  if (lVar31 < 0) {
                    pSVar10[segment].intersection = (int)(lVar35 + 1) + -1;
                  }
                  else {
                    iVar6 = pIVar12[lVar31].next;
                    pIVar23 = pIVar12 + lVar31;
                    while (iVar6 != 0) {
                      lVar31 = (long)iVar6;
                      iVar6 = pIVar23[iVar6].next;
                      pIVar23 = pIVar23 + lVar31;
                    }
                    pIVar23->next = (int)lVar35 - (int)((ulong)((long)pIVar23 - (long)pIVar12) >> 4)
                    ;
                  }
                  pQVar9 = this->m_segments;
                  QDataBuffer<QPathSegments::Intersection>::reserve
                            (&pQVar9->m_intersections,(pQVar9->m_intersections).siz + 1);
                  lVar35 = (pQVar9->m_intersections).siz;
                  pIVar12 = (pQVar9->m_intersections).buffer;
                  pIVar12[lVar35].t = qVar3;
                  pIVar12[lVar35].vertex = iVar34;
                  pIVar12[lVar35].next = 0;
                  (pQVar9->m_intersections).siz = lVar35 + 1;
                  pSVar10 = (pQVar9->m_segments).buffer;
                  lVar31 = (long)pSVar10[iVar5].intersection;
                  if (lVar31 < 0) {
                    pSVar10[iVar5].intersection = (int)(lVar35 + 1) + -1;
                  }
                  else {
                    iVar34 = pIVar12[lVar31].next;
                    pIVar23 = pIVar12 + lVar31;
                    while (iVar34 != 0) {
                      lVar31 = (long)iVar34;
                      iVar34 = pIVar23[iVar34].next;
                      pIVar23 = pIVar23 + lVar31;
                    }
                    pIVar23->next = (int)lVar35 - (int)((ulong)((long)pIVar23 - (long)pIVar12) >> 4)
                    ;
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar32 < (this->m_intersections).siz);
              }
            }
          }
        }
        lVar33 = lVar33 + 1;
      } while (lVar33 < (node->index).interval.last);
    }
  }
  else {
    local_58._0_8_ = nodeBounds->x1;
    local_58._8_8_ = nodeBounds->y1;
    local_48.xp = nodeBounds->x2;
    local_48.yp = nodeBounds->y2;
    dVar4 = node->splitLeft;
    (&local_48.xp)[(uint)axis] = dVar4;
    local_78.x1 = nodeBounds->x1;
    local_78.y1 = nodeBounds->y1;
    local_78.x2 = nodeBounds->x2;
    local_78.y2 = nodeBounds->y2;
    (&local_78.x1)[(uint)axis] = node->splitRight;
    if ((node->lowestLeftIndex < segment) && ((&segmentBounds->x1)[(uint)axis] <= dVar4)) {
      produceIntersections
                (this,(this->m_tree).d.ptr + (node->index).interval.first,segment,segmentBounds,
                 (RectF *)local_58,(uint)(axis == 0));
    }
    if ((node->lowestRightIndex < segment) && (node->splitRight <= (&segmentBounds->x2)[(uint)axis])
       ) {
      produceIntersections
                (this,(this->m_tree).d.ptr + (node->index).interval.last,segment,segmentBounds,
                 &local_78,(uint)(axis == 0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SegmentTree::produceIntersections(const TreeNode &node, int segment, const RectF &segmentBounds, const RectF &nodeBounds, int axis)
{
    if (node.leaf) {
        produceIntersectionsLeaf(node, segment);
        return;
    }

    RectF lbounds = nodeBounds;
    (&lbounds.x2)[axis] = node.splitLeft;

    RectF rbounds = nodeBounds;
    (&rbounds.x1)[axis] = node.splitRight;

    if (segment > node.lowestLeftIndex && (&segmentBounds.x1)[axis] <= node.splitLeft)
        produceIntersections(m_tree.at(node.index.children.left), segment, segmentBounds, lbounds, !axis);

    if (segment > node.lowestRightIndex && (&segmentBounds.x2)[axis] >= node.splitRight)
        produceIntersections(m_tree.at(node.index.children.right), segment, segmentBounds, rbounds, !axis);
}